

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_conversions.hpp
# Opt level: O2

Boxed_Value __thiscall
chaiscript::detail::Static_Caster<chaiscript::exception::arithmetic_error,_std::exception>::cast
          (Static_Caster<chaiscript::exception::arithmetic_error,_std::exception> *this,
          Boxed_Value *t_from)

{
  uint uVar1;
  element_type *peVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  reference_wrapper<std::exception> obj;
  reference_wrapper<const_std::exception> obj_00;
  bool bVar7;
  undefined8 *puVar8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  shared_ptr<chaiscript::Boxed_Value::Data> sVar10;
  Boxed_Value BVar11;
  undefined1 in_stack_ffffffffffffffcf;
  shared_ptr<const_std::exception> local_30;
  uint uVar12;
  undefined4 in_stack_ffffffffffffffe4;
  
  local_30.super___shared_ptr<const_std::exception,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&chaiscript::exception::arithmetic_error::typeinfo;
  local_30.super___shared_ptr<const_std::exception,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       &chaiscript::exception::arithmetic_error::typeinfo;
  uVar12 = 0;
  bVar7 = Type_Info::bare_equal
                    (&((t_from->m_data).
                       super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)->m_type_info,(Type_Info *)&local_30);
  if (bVar7) {
    peVar2 = (t_from->m_data).
             super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    uVar1 = (peVar2->m_type_info).m_flags;
    if (peVar2->m_is_ref == false) {
      if ((uVar1 & 1) == 0) {
        cast::anon_class_8_1_6c80e9d3::operator()((anon_class_8_1_6c80e9d3 *)&local_30);
        Boxed_Value::Object_Data::get<std::exception>
                  ((Object_Data *)this,(shared_ptr<std::exception> *)&local_30,false);
      }
      else {
        cast::anon_class_8_1_6c80e9d3::operator()((anon_class_8_1_6c80e9d3 *)&local_30);
        Boxed_Value::Object_Data::get<std::exception_const>((Object_Data *)this,&local_30,false);
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_30.super___shared_ptr<const_std::exception,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      _Var9._M_pi = extraout_RDX;
    }
    else if ((uVar1 & 1) == 0) {
      Cast_Helper_Inner<chaiscript::exception::arithmetic_error_&>::cast
                (t_from,(Type_Conversions_State *)0x0);
      obj._M_data._4_4_ = in_stack_ffffffffffffffe4;
      obj._M_data._0_4_ = uVar12;
      sVar10 = Boxed_Value::Object_Data::get<std::exception>(obj,(bool)in_stack_ffffffffffffffcf);
      _Var9 = sVar10.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    }
    else {
      Cast_Helper_Inner<const_chaiscript::exception::arithmetic_error_&>::cast
                (t_from,(Type_Conversions_State *)0x0);
      obj_00._M_data._4_4_ = in_stack_ffffffffffffffe4;
      obj_00._M_data._0_4_ = uVar12;
      sVar10 = Boxed_Value::Object_Data::get<std::exception_const>
                         (obj_00,(bool)in_stack_ffffffffffffffcf);
      _Var9 = sVar10.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    }
    BVar11.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = _Var9._M_pi;
    BVar11.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)this;
    return (Boxed_Value)
           BVar11.m_data.
           super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
  }
  puVar8 = (undefined8 *)__cxa_allocate_exception(0x38);
  peVar2 = (t_from->m_data).
           super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  uVar3 = *(undefined8 *)&(peVar2->m_type_info).m_flags;
  uVar4 = *(undefined4 *)((long)&(peVar2->m_type_info).m_type_info + 4);
  uVar5 = *(undefined4 *)&(peVar2->m_type_info).m_bare_type_info;
  uVar6 = *(undefined4 *)((long)&(peVar2->m_type_info).m_bare_type_info + 4);
  *(undefined4 *)(puVar8 + 1) = *(undefined4 *)&(peVar2->m_type_info).m_type_info;
  *(undefined4 *)((long)puVar8 + 0xc) = uVar4;
  *(undefined4 *)(puVar8 + 2) = uVar5;
  *(undefined4 *)((long)puVar8 + 0x14) = uVar6;
  puVar8[3] = uVar3;
  puVar8[4] = &std::exception::typeinfo;
  puVar8[5] = 0x1f;
  puVar8[6] = "Unknown dynamic_cast_conversion";
  *puVar8 = &PTR__bad_cast_004535b8;
  __cxa_throw(puVar8,&chaiscript::exception::bad_boxed_dynamic_cast::typeinfo,
              std::bad_cast::~bad_cast);
}

Assistant:

static Boxed_Value cast(const Boxed_Value &t_from) {
        if (t_from.get_type_info().bare_equal(chaiscript::user_type<From>())) {
          if (t_from.is_pointer()) {
            // Dynamic cast out the contained boxed value, which we know is the type we want
            if (t_from.is_const()) {
              return Boxed_Value([&]() {
                if (auto data
                    = std::static_pointer_cast<const To>(detail::Cast_Helper<std::shared_ptr<const From>>::cast(t_from, nullptr))) {
                  return data;
                } else {
                  throw std::bad_cast();
                }
              }());
            } else {
              return Boxed_Value([&]() {
                if (auto data = std::static_pointer_cast<To>(detail::Cast_Helper<std::shared_ptr<From>>::cast(t_from, nullptr))) {
                  return data;
                } else {
                  throw std::bad_cast();
                }
              }());
            }
          } else {
            // Pull the reference out of the contained boxed value, which we know is the type we want
            if (t_from.is_const()) {
              const From &d = detail::Cast_Helper<const From &>::cast(t_from, nullptr);
              const To &data = static_cast<const To &>(d);
              return Boxed_Value(std::cref(data));
            } else {
              From &d = detail::Cast_Helper<From &>::cast(t_from, nullptr);
              To &data = static_cast<To &>(d);
              return Boxed_Value(std::ref(data));
            }
          }
        } else {
          throw chaiscript::exception::bad_boxed_dynamic_cast(t_from.get_type_info(), typeid(To), "Unknown dynamic_cast_conversion");
        }
      }